

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_negate(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  
  if (getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar1 != 0) {
      getp_negate::desc.min_argc_ = 0;
      getp_negate::desc.opt_argc_ = 0;
      getp_negate::desc.varargs_ = 0;
      __cxa_guard_release(&getp_negate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_negate::desc);
  if (iVar1 == 0) {
    (*(this->super_CVmObject)._vptr_CVmObject[0x26])(this,retval,self);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_negate(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* negate the value */
    neg_val(vmg_ retval, self);

    /* handled */
    return TRUE;
}